

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_ADJ_ITEM pRVar5;
  long lVar6;
  ulong uVar7;
  REF_INT RVar8;
  ulong uVar9;
  ulong uVar10;
  
  pRVar3 = ref_grid->node;
  *allowed = 0;
  pRVar4 = ref_grid->cell[3];
  uVar7 = 0xffffffff;
  if (-1 < node0) {
    uVar7 = 0xffffffff;
    if (node0 < pRVar4->ref_adj->nnode) {
      uVar7 = (ulong)(uint)pRVar4->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar7 != -1) {
    RVar8 = pRVar4->ref_adj->item[(int)uVar7].ref;
    uVar1 = pRVar4->node_per;
    do {
      if (0 < (int)uVar1) {
        lVar6 = (long)RVar8 * (long)pRVar4->size_per;
        uVar9 = 0;
        do {
          if (pRVar4->c2n[(long)(int)lVar6 + uVar9] == node1) {
            uVar10 = 0;
            do {
              if (pRVar3->ref_mpi->id != pRVar3->part[pRVar4->c2n[lVar6 + uVar10]]) {
                return 0;
              }
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar1);
      }
      pRVar5 = pRVar4->ref_adj->item;
      iVar2 = pRVar5[(int)uVar7].next;
      uVar7 = (ulong)iVar2;
      if (uVar7 == 0xffffffffffffffff) {
        RVar8 = -1;
      }
      else {
        RVar8 = pRVar5[uVar7].ref;
      }
    } while (iVar2 != -1);
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_swap_local_cell(REF_GRID ref_grid, REF_INT node0,
                                       REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, search_node, test_node;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}